

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2413.c
# Opt level: O3

void load_instrument(YM2413 *chip,UINT32 chan,UINT32 slot,UINT8 *inst)

{
  OPLL_SLOT *pOVar1;
  OPLL_SLOT *pOVar2;
  byte bVar3;
  UINT32 UVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uchar uVar8;
  ulong uVar9;
  uchar uVar10;
  ulong uVar11;
  uint uVar12;
  uchar uVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  long lVar17;
  
  bVar3 = *inst;
  uVar7 = slot >> 1;
  uVar6 = slot & 1;
  bVar16 = "\x01\x02\x04\x06\b\n\f\x0e\x10\x12\x14\x14\x18\x18\x1e\x1e"[(int)(char)bVar3 & 0xf];
  chip->P_CH[uVar7].SLOT[uVar6].mul = bVar16;
  bVar5 = (byte)~bVar3 >> 3 & 2;
  chip->P_CH[uVar7].SLOT[uVar6].KSR = bVar5;
  chip->P_CH[uVar7].SLOT[uVar6].eg_type = bVar3 & 0x20;
  chip->P_CH[uVar7].SLOT[uVar6].vib = bVar3 & 0x40;
  chip->P_CH[uVar7].SLOT[uVar6].AMmask = (int)(char)bVar3 >> 7;
  chip->P_CH[uVar7].SLOT[uVar6].freq = (uint)bVar16 * chip->P_CH[uVar7].fc;
  bVar16 = chip->P_CH[uVar7].kcode >> bVar5;
  uVar12 = (uint)bVar16;
  pOVar1 = chip->P_CH[uVar7].SLOT + uVar6;
  bVar3 = chip->P_CH[uVar7].SLOT[uVar6].ksr;
  uVar9 = (ulong)bVar3;
  if (uVar12 != bVar3) {
    pOVar1->ksr = bVar16;
    uVar6 = pOVar1->ar + uVar12;
    if (uVar6 < 0x4e) {
      uVar8 = ""[uVar6];
      uVar10 = "pppppppppppppppp"[uVar6];
    }
    else {
      uVar10 = 'h';
      uVar8 = '\0';
    }
    pOVar1->eg_sh_ar = uVar8;
    pOVar1->eg_sel_ar = uVar10;
    uVar6 = pOVar1->dr + uVar12;
    pOVar1->eg_sh_dr = ""[uVar6];
    pOVar1->eg_sel_dr = "pppppppppppppppp"[uVar6];
    uVar6 = uVar12 + pOVar1->rr;
    pOVar1->eg_sh_rr = ""[uVar6];
    pOVar1->eg_sel_rr = "pppppppppppppppp"[uVar6];
    uVar9 = (ulong)uVar12;
  }
  lVar17 = uVar9 + 0x24 + (ulong)(chip->P_CH[uVar7].sus == '\0') * 8;
  pOVar1->eg_sh_rs = ""[lVar17];
  pOVar1->eg_sel_rs = "pppppppppppppppp"[lVar17];
  pOVar1->eg_sh_dp = ""[uVar9 + 0x44];
  pOVar1->eg_sel_dp = "pppppppppppppppp"[uVar9 + 0x44];
  bVar3 = inst[1];
  uVar6 = slot + 1 >> 1;
  uVar7 = slot + 1 & 1;
  bVar16 = "\x01\x02\x04\x06\b\n\f\x0e\x10\x12\x14\x14\x18\x18\x1e\x1e"[(int)(char)bVar3 & 0xf];
  chip->P_CH[uVar6].SLOT[uVar7].mul = bVar16;
  bVar5 = (byte)~bVar3 >> 3 & 2;
  chip->P_CH[uVar6].SLOT[uVar7].KSR = bVar5;
  chip->P_CH[uVar6].SLOT[uVar7].eg_type = bVar3 & 0x20;
  chip->P_CH[uVar6].SLOT[uVar7].vib = bVar3 & 0x40;
  chip->P_CH[uVar6].SLOT[uVar7].AMmask = (int)(char)bVar3 >> 7;
  chip->P_CH[uVar6].SLOT[uVar7].freq = (uint)bVar16 * chip->P_CH[uVar6].fc;
  bVar16 = chip->P_CH[uVar6].kcode >> bVar5;
  uVar12 = (uint)bVar16;
  pOVar2 = chip->P_CH[uVar6].SLOT + uVar7;
  bVar3 = chip->P_CH[uVar6].SLOT[uVar7].ksr;
  uVar7 = (uint)bVar3;
  if (uVar12 != bVar3) {
    pOVar2->ksr = bVar16;
    uVar7 = pOVar2->ar + uVar12;
    if (uVar7 < 0x4e) {
      uVar8 = ""[uVar7];
      uVar10 = "pppppppppppppppp"[uVar7];
    }
    else {
      uVar10 = 'h';
      uVar8 = '\0';
    }
    pOVar2->eg_sh_ar = uVar8;
    pOVar2->eg_sel_ar = uVar10;
    uVar7 = pOVar2->dr + uVar12;
    pOVar2->eg_sh_dr = ""[uVar7];
    pOVar2->eg_sel_dr = "pppppppppppppppp"[uVar7];
    uVar7 = uVar12 + pOVar2->rr;
    pOVar2->eg_sh_rr = ""[uVar7];
    pOVar2->eg_sel_rr = "pppppppppppppppp"[uVar7];
    uVar9 = (ulong)pOVar1->ksr;
    uVar7 = uVar12;
  }
  uVar15 = (ulong)uVar7;
  lVar17 = uVar15 + 0x24 + (ulong)(chip->P_CH[uVar6].sus == '\0') * 8;
  pOVar2->eg_sh_rs = ""[lVar17];
  pOVar2->eg_sel_rs = "pppppppppppppppp"[lVar17];
  pOVar2->eg_sh_dp = ""[uVar15 + 0x44];
  pOVar2->eg_sel_dp = "pppppppppppppppp"[uVar15 + 0x44];
  bVar3 = inst[2];
  UVar4 = ksl_shift[bVar3 >> 6];
  chip->P_CH[chan].SLOT[0].ksl = (byte)UVar4;
  uVar6 = (uint)bVar3 + (uint)bVar3 & 0x7e;
  chip->P_CH[chan].SLOT[0].TL = uVar6;
  uVar7 = chip->P_CH[chan].ksl_base;
  chip->P_CH[chan].SLOT[0].TLL = (uVar7 >> ((byte)UVar4 & 0x1f)) + uVar6;
  bVar3 = inst[3];
  chip->P_CH[chan].SLOT[0].wavetable = (bVar3 & 8) << 7;
  bVar16 = (bVar3 & 7) + 8;
  if ((bVar3 & 7) == 0) {
    bVar16 = bVar3 & 7;
  }
  chip->P_CH[chan].SLOT[0].fb_shift = bVar16;
  UVar4 = ksl_shift[bVar3 >> 6];
  chip->P_CH[chan].SLOT[1].ksl = (byte)UVar4;
  chip->P_CH[chan].SLOT[1].TLL = (uVar7 >> ((byte)UVar4 & 0x1f)) + chip->P_CH[chan].SLOT[1].TL;
  chip->P_CH[chan].SLOT[1].wavetable = (bVar3 & 0x10) << 6;
  bVar3 = inst[4];
  uVar11 = 0;
  uVar14 = (ulong)((uint)(bVar3 >> 4) * 4 + 0x10);
  if (bVar3 < 0x10) {
    uVar14 = uVar11;
  }
  pOVar1->ar = (UINT32)uVar14;
  lVar17 = uVar9 + uVar14;
  uVar13 = 'h';
  uVar8 = '\0';
  uVar10 = 'h';
  if ((uint)lVar17 < 0x4e) {
    uVar8 = ""[lVar17];
    uVar10 = "pppppppppppppppp"[lVar17];
  }
  pOVar1->eg_sh_ar = uVar8;
  pOVar1->eg_sel_ar = uVar10;
  uVar7 = (bVar3 & 0xf) * 4 + 0x10;
  if ((bVar3 & 0xf) == 0) {
    uVar7 = bVar3 & 0xf;
  }
  pOVar1->dr = uVar7;
  pOVar1->eg_sh_dr = ""[uVar7 + uVar9];
  pOVar1->eg_sel_dr = "pppppppppppppppp"[uVar7 + uVar9];
  bVar3 = inst[5];
  uVar14 = (ulong)((uint)(bVar3 >> 4) * 4 + 0x10);
  if (bVar3 < 0x10) {
    uVar14 = uVar11;
  }
  pOVar2->ar = (UINT32)uVar14;
  lVar17 = uVar14 + uVar15;
  if ((uint)lVar17 < 0x4e) {
    uVar11 = (ulong)""[lVar17];
    uVar13 = "pppppppppppppppp"[lVar17];
  }
  pOVar2->eg_sh_ar = (UINT8)uVar11;
  pOVar2->eg_sel_ar = uVar13;
  uVar7 = (bVar3 & 0xf) * 4 + 0x10;
  if ((bVar3 & 0xf) == 0) {
    uVar7 = bVar3 & 0xf;
  }
  pOVar2->dr = uVar7;
  pOVar2->eg_sh_dr = ""[uVar7 + uVar15];
  pOVar2->eg_sel_dr = "pppppppppppppppp"[uVar7 + uVar15];
  bVar3 = inst[6];
  pOVar1->sl = sl_tab[bVar3 >> 4];
  uVar7 = (bVar3 & 0xf) * 4 + 0x10;
  if ((bVar3 & 0xf) == 0) {
    uVar7 = bVar3 & 0xf;
  }
  pOVar1->rr = uVar7;
  pOVar1->eg_sh_rr = ""[uVar9 + uVar7];
  pOVar1->eg_sel_rr = "pppppppppppppppp"[uVar9 + uVar7];
  bVar3 = inst[7];
  pOVar2->sl = sl_tab[bVar3 >> 4];
  uVar7 = (bVar3 & 0xf) * 4 + 0x10;
  if ((bVar3 & 0xf) == 0) {
    uVar7 = bVar3 & 0xf;
  }
  pOVar2->rr = uVar7;
  pOVar2->eg_sh_rr = ""[uVar7 + uVar15];
  pOVar2->eg_sel_rr = "pppppppppppppppp"[uVar7 + uVar15];
  return;
}

Assistant:

static void load_instrument(YM2413 *chip, UINT32 chan, UINT32 slot, UINT8* inst )
{
	set_mul         (chip, slot,   inst[0]);
	set_mul         (chip, slot+1, inst[1]);
	set_ksl_tl      (chip, chan,   inst[2]);
	set_ksl_wave_fb (chip, chan,   inst[3]);
	set_ar_dr       (chip, slot,   inst[4]);
	set_ar_dr       (chip, slot+1, inst[5]);
	set_sl_rr       (chip, slot,   inst[6]);
	set_sl_rr       (chip, slot+1, inst[7]);
}